

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcplisten.c
# Opt level: O0

void tcp_listener_doaccept(tcp_listener *l)

{
  int *piVar1;
  nni_tcp_conn *local_38;
  nni_tcp_conn *c;
  uint local_28;
  int ka;
  int nd;
  int rv;
  int fd;
  int newfd;
  nni_aio *aio;
  tcp_listener *l_local;
  
  aio = (nni_aio *)l;
  while( true ) {
    while( true ) {
      while( true ) {
        _fd = (nni_aio *)nni_list_first((nni_list *)(aio->a_iov + 6));
        if (_fd == (nni_aio *)0x0) {
          return;
        }
        nd = nni_posix_pfd_fd((nni_posix_pfd *)&aio->a_iov[2].iov_len);
        rv = accept(nd,(sockaddr *)0x0,(socklen_t *)0x0);
        if (rv < 0) break;
        ka = nni_posix_tcp_alloc(&local_38,(nni_tcp_dialer *)0x0,rv);
        if (ka == 0) {
          c._4_4_ = (uint)((aio->a_iov[7].iov_len & 0x1000000) != 0);
          local_28 = (uint)((aio->a_iov[7].iov_len & 0x10000) != 0);
          nni_aio_list_remove(_fd);
          nni_posix_tcp_start(local_38,local_28,c._4_4_);
          nni_aio_set_output(_fd,0,local_38);
          nni_aio_finish(_fd,NNG_OK,0);
        }
        else {
          close(rv);
          nni_aio_list_remove(_fd);
          nni_aio_finish_error(_fd,ka);
        }
      }
      piVar1 = __errno_location();
      if (*piVar1 == 0xb) break;
      if (1 < *piVar1 - 0x67U) {
        piVar1 = __errno_location();
        ka = nni_plat_errno(*piVar1);
        if (ka == 0) {
          nni_panic("%s: %d: assert err: %s",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/posix/posix_tcplisten.c"
                    ,0x7b,"rv != 0");
        }
        nni_aio_list_remove(_fd);
        nni_aio_finish_error(_fd,ka);
      }
    }
    ka = nni_posix_pfd_arm((nni_posix_pfd *)&aio->a_iov[2].iov_len,1);
    if (ka == 0) break;
    nni_aio_list_remove(_fd);
    nni_aio_finish_error(_fd,ka);
  }
  return;
}

Assistant:

static void
tcp_listener_doaccept(tcp_listener *l)
{
	nni_aio *aio;

	while ((aio = nni_list_first(&l->acceptq)) != NULL) {
		int           newfd;
		int           fd;
		int           rv;
		int           nd;
		int           ka;
		nni_tcp_conn *c;

		fd = nni_posix_pfd_fd(&l->pfd);

#ifdef NNG_USE_ACCEPT4
		newfd = accept4(fd, NULL, NULL, SOCK_CLOEXEC);
		if ((newfd < 0) && ((errno == ENOSYS) || (errno == ENOTSUP))) {
			newfd = accept(fd, NULL, NULL);
		}
#else
		newfd = accept(fd, NULL, NULL);
#endif
		if (newfd < 0) {
			switch (errno) {
			case EAGAIN:
#ifdef EWOULDBLOCK
#if EWOULDBLOCK != EAGAIN
			case EWOULDBLOCK:
#endif
#endif
				rv = nni_posix_pfd_arm(&l->pfd, NNI_POLL_IN);
				if (rv != 0) {
					nni_aio_list_remove(aio);
					nni_aio_finish_error(aio, rv);
					continue;
				}
				// Come back later...
				return;
			case ECONNABORTED:
			case ECONNRESET:
				// Eat them, they aren't interesting.
				continue;
			default:
				// Error this one, but keep moving to the next.
				rv = nni_plat_errno(errno);
				NNI_ASSERT(rv != 0);
				nni_aio_list_remove(aio);
				nni_aio_finish_error(aio, rv);
				continue;
			}
		}

		if ((rv = nni_posix_tcp_alloc(&c, NULL, newfd)) != 0) {
			close(newfd);
			nni_aio_list_remove(aio);
			nni_aio_finish_error(aio, rv);
			continue;
		}

		ka = l->keepalive ? 1 : 0;
		nd = l->nodelay ? 1 : 0;
		nni_aio_list_remove(aio);
		nni_posix_tcp_start(c, nd, ka);
		nni_aio_set_output(aio, 0, c);
		nni_aio_finish(aio, 0, 0);
	}
}